

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O2

Grammar * __thiscall
xercesc_4_0::XercesDOMParser::loadGrammar
          (XercesDOMParser *this,char *systemId,GrammarType grammarType,bool toCache)

{
  XMLScanner *this_00;
  Grammar *pGVar1;
  IOException *this_01;
  ResetParseType_conflict resetParse;
  
  if ((this->super_AbstractDOMParser).fParseInProgress != true) {
    resetParse.fToCall = (MFPT)XercesDOMParser::resetParse;
    resetParse._16_8_ = 0;
    (this->super_AbstractDOMParser).fParseInProgress = true;
    this_00 = (this->super_AbstractDOMParser).fScanner;
    if (grammarType == DTDGrammarType) {
      this_00->fDocTypeHandler = (DocTypeHandler *)0x0;
    }
    resetParse.fObject = this;
    pGVar1 = XMLScanner::loadGrammar(this_00,systemId,(short)grammarType,toCache);
    JanitorMemFunCall<xercesc_4_0::XercesDOMParser>::~JanitorMemFunCall(&resetParse);
    return pGVar1;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x30);
  IOException::IOException
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/parsers/XercesDOMParser.cpp"
             ,0xfc,Gen_ParseInProgress,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_01,&IOException::typeinfo,XMLException::~XMLException);
}

Assistant:

Grammar* XercesDOMParser::loadGrammar(const char* const systemId,
                                      const Grammar::GrammarType grammarType,
                                      const bool toCache)
{
    // Avoid multiple entrance
    if (getParseInProgress())
        ThrowXMLwithMemMgr(IOException, XMLExcepts::Gen_ParseInProgress, fMemoryManager);

    ResetParseType  resetParse(this, &XercesDOMParser::resetParse);

    Grammar* grammar = 0;

    try
    {
        setParseInProgress(true);
        if (grammarType == Grammar::DTDGrammarType)
            getScanner()->setDocTypeHandler(0);
        grammar = getScanner()->loadGrammar(systemId, grammarType, toCache);
    }
    catch(const OutOfMemoryException&)
    {
        resetParse.release();

        throw;
    }

    return grammar;
}